

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void __thiscall re2::Regexp::ParseState::DoCollapse(ParseState *this,RegexpOp op)

{
  bool bVar1;
  RegexpOp RVar2;
  Regexp **ppRVar3;
  Regexp **ppRVar4;
  Regexp *pRVar5;
  byte local_72;
  byte local_71;
  Regexp *re;
  int k;
  Regexp **sub_subs;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  PODArray<re2::Regexp_*> subs;
  Regexp *sub;
  Regexp *next;
  int n;
  RegexpOp op_local;
  ParseState *this_local;
  
  next._0_4_ = 0;
  sub = (Regexp *)0x0;
  subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>._M_t.
  super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
  super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl = (Regexp **)this->stacktop_;
  while( true ) {
    local_71 = 0;
    if (subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
        super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl != (Regexp **)0x0) {
      RVar2 = Regexp::op((Regexp *)
                         subs.ptr_._M_t.
                         super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                         .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl);
      bVar1 = IsMarker(this,RVar2);
      local_71 = bVar1 ^ 0xff;
    }
    if ((local_71 & 1) == 0) break;
    sub = subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
          ._M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
          super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[2];
    if (*(byte *)subs.ptr_._M_t.
                 super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
                 super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl == op) {
      next._0_4_ = (uint)*(ushort *)
                          ((long)subs.ptr_._M_t.
                                 super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                                 .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl + 6) +
                   (int)next;
      subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>.
      _M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
      super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl = (Regexp **)sub;
    }
    else {
      next._0_4_ = (int)next + 1;
      subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>.
      _M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
      super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl = (Regexp **)sub;
    }
  }
  if ((this->stacktop_ == (Regexp *)0x0) || (this->stacktop_->down_ != sub)) {
    PODArray<re2::Regexp_*>::PODArray((PODArray<re2::Regexp_*> *)local_38,(int)next);
    sub = (Regexp *)0x0;
    local_3c = (int)next;
    subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
    super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl = (Regexp **)this->stacktop_;
    while( true ) {
      local_72 = 0;
      if (subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
          ._M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
          super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl != (Regexp **)0x0) {
        RVar2 = Regexp::op((Regexp *)
                           subs.ptr_._M_t.
                           super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                           .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl);
        bVar1 = IsMarker(this,RVar2);
        local_72 = bVar1 ^ 0xff;
      }
      if ((local_72 & 1) == 0) break;
      sub = subs.ptr_._M_t.
            super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>._M_t.
            super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
            super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl[2];
      if (*(byte *)subs.ptr_._M_t.
                   super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
                   super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl == op) {
        ppRVar4 = Regexp::sub(subs.ptr_._M_t.
                              super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                              .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl);
        re._4_4_ = (uint)*(ushort *)
                          ((long)subs.ptr_._M_t.
                                 super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                                 .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl + 6);
        while (re._4_4_ = re._4_4_ - 1, -1 < (int)re._4_4_) {
          pRVar5 = Incref(ppRVar4[(int)re._4_4_]);
          local_3c = local_3c + -1;
          ppRVar3 = PODArray<re2::Regexp_*>::operator[]
                              ((PODArray<re2::Regexp_*> *)local_38,local_3c);
          *ppRVar3 = pRVar5;
        }
        Decref((Regexp *)
               subs.ptr_._M_t.
               super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
               super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl);
        subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
        super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl = (Regexp **)sub;
      }
      else {
        pRVar5 = FinishRegexp(this,(Regexp *)
                                   subs.ptr_._M_t.
                                   super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>
                                   .super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl);
        local_3c = local_3c + -1;
        ppRVar4 = PODArray<re2::Regexp_*>::operator[]((PODArray<re2::Regexp_*> *)local_38,local_3c);
        *ppRVar4 = pRVar5;
        subs.ptr_._M_t.super___uniq_ptr_impl<re2::Regexp_*,_re2::PODArray<re2::Regexp_*>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_re2::Regexp_**,_re2::PODArray<re2::Regexp_*>::Deleter>.
        super__Head_base<0UL,_re2::Regexp_**,_false>._M_head_impl = (Regexp **)sub;
      }
    }
    ppRVar4 = PODArray<re2::Regexp_*>::data((PODArray<re2::Regexp_*> *)local_38);
    pRVar5 = ConcatOrAlternate(op,ppRVar4,(int)next,this->flags_,true);
    bVar1 = ComputeSimple(pRVar5);
    pRVar5->simple_ = bVar1;
    pRVar5->down_ = sub;
    this->stacktop_ = pRVar5;
    PODArray<re2::Regexp_*>::~PODArray((PODArray<re2::Regexp_*> *)local_38);
  }
  return;
}

Assistant:

void Regexp::ParseState::DoCollapse(RegexpOp op) {
  // Scan backward to marker, counting children of composite.
  int n = 0;
  Regexp* next = NULL;
  Regexp* sub;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op)
      n += sub->nsub_;
    else
      n++;
  }

  // If there's just one child, leave it alone.
  // (Concat of one thing is that one thing; alternate of one thing is same.)
  if (stacktop_ != NULL && stacktop_->down_ == next)
    return;

  // Construct op (alternation or concatenation), flattening op of op.
  PODArray<Regexp*> subs(n);
  next = NULL;
  int i = n;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op) {
      Regexp** sub_subs = sub->sub();
      for (int k = sub->nsub_ - 1; k >= 0; k--)
        subs[--i] = sub_subs[k]->Incref();
      sub->Decref();
    } else {
      subs[--i] = FinishRegexp(sub);
    }
  }

  Regexp* re = ConcatOrAlternate(op, subs.data(), n, flags_, true);
  re->simple_ = re->ComputeSimple();
  re->down_ = next;
  stacktop_ = re;
}